

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O2

char * rapidjson::internal::i64toa(int64_t value,char *buffer)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  ushort uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (buffer == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/j05070415[P]RJson/rapidjson/include/rapidjson/internal/itoa.h"
                  ,0x127,"char *rapidjson::internal::i64toa(int64_t, char *)");
  }
  if (value < 0) {
    *buffer = '-';
    pcVar9 = u64toa(-value,buffer + 1);
    return pcVar9;
  }
  if (buffer == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/j05070415[P]RJson/rapidjson/include/rapidjson/internal/itoa.h"
                  ,0x7f,"char *rapidjson::internal::u64toa(uint64_t, char *)");
  }
  if ((ulong)value < 100000000) {
    if (9999 < (ulong)value) {
      uVar2 = (uint)(ushort)((value & 0xffffffffU) % 10000);
      uVar1 = (int)((value & 0xffffffffU) / 1000000) * 2;
      uVar11 = (ulong)(((uint)(ushort)((value & 0xffffffffU) / 10000) % 100) * 2);
      uVar5 = (uVar2 / 100) * 2;
      uVar10 = (ulong)((uVar2 % 100) * 2);
      if ((ulong)value < 10000000) {
        if (999999 < (ulong)value) goto LAB_00106fe5;
        if ((ulong)value < 100000) goto LAB_00107007;
      }
      else {
        *buffer = GetDigitsLut()::cDigitsLut[uVar1];
        buffer = buffer + 1;
LAB_00106fe5:
        *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar1 + 1];
        buffer = buffer + 1;
      }
      *buffer = GetDigitsLut()::cDigitsLut[uVar11];
      buffer = buffer + 1;
LAB_00107007:
      *buffer = GetDigitsLut()::cDigitsLut[uVar11 + 1];
      buffer[1] = GetDigitsLut()::cDigitsLut[uVar5];
      buffer[2] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar5 + 1];
      buffer[3] = GetDigitsLut()::cDigitsLut[uVar10];
      buffer[4] = GetDigitsLut()::cDigitsLut[uVar10 + 1];
      return buffer + 5;
    }
    lVar4 = ((value & 0xffffffffU) / 100) * 2;
    uVar10 = (ulong)(uint)((int)((value & 0xffffffffU) % 100) * 2);
    if ((ulong)value < 1000) {
      if (99 < (ulong)value) goto LAB_00106eb5;
      if ((ulong)value < 10) goto LAB_00106ed6;
    }
    else {
      *buffer = GetDigitsLut()::cDigitsLut[lVar4];
      buffer = buffer + 1;
LAB_00106eb5:
      *buffer = GetDigitsLut()::cDigitsLut[lVar4 + 1];
      buffer = buffer + 1;
    }
    *buffer = GetDigitsLut()::cDigitsLut[uVar10];
    buffer = buffer + 1;
LAB_00106ed6:
    *buffer = GetDigitsLut()::cDigitsLut[uVar10 + 1];
    return buffer + 1;
  }
  if (9999999999999999 < (ulong)value) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = value;
    auVar3 = auVar3 / ZEXT816(10000000000000000);
    if ((ulong)value < 100000000000000000) {
      *buffer = auVar3[0] | 0x30;
      pcVar9 = buffer + 1;
    }
    else if ((ulong)value < 1000000000000000000) {
      *buffer = GetDigitsLut()::cDigitsLut[(auVar3._0_8_ & 0xffffffff) * 2];
      buffer[1] = GetDigitsLut()::cDigitsLut[(ulong)(uint)(auVar3._0_4_ * 2) + 1];
      pcVar9 = buffer + 2;
    }
    else {
      uVar7 = auVar3._0_2_;
      uVar2 = uVar7 / 100;
      if ((ulong)value < 10000000000000000000) {
        *buffer = (char)uVar2 + '0';
        *(undefined2 *)(buffer + 1) =
             *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar7 % 100) * 2);
        pcVar9 = buffer + 3;
      }
      else {
        uVar10 = (ulong)(uVar2 * 2);
        uVar11 = (ulong)(((uint)uVar7 % 100) * 2);
        *buffer = GetDigitsLut()::cDigitsLut[uVar10];
        buffer[1] = GetDigitsLut()::cDigitsLut[uVar10 + 1];
        buffer[2] = GetDigitsLut()::cDigitsLut[uVar11];
        buffer[3] = GetDigitsLut()::cDigitsLut[uVar11 + 1];
        pcVar9 = buffer + 4;
      }
    }
    uVar10 = ((ulong)value % 10000000000000000) / 100000000;
    uVar11 = ((ulong)value % 10000000000000000) % 100000000;
    uVar7 = (ushort)(uVar10 % 10000);
    uVar8 = (ushort)(uVar11 % 10000);
    *(undefined2 *)pcVar9 = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar10 / 1000000) * 2);
    *(undefined2 *)(pcVar9 + 2) =
         *(undefined2 *)
          (GetDigitsLut()::cDigitsLut + (ulong)(ushort)((ushort)(uVar10 / 10000) % 100) * 2);
    *(undefined2 *)(pcVar9 + 4) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar7 / 100) * 2);
    *(undefined2 *)(pcVar9 + 6) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar7 % 100) * 2);
    *(undefined2 *)(pcVar9 + 8) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar11 / 1000000) * 2);
    *(undefined2 *)(pcVar9 + 10) =
         *(undefined2 *)
          (GetDigitsLut()::cDigitsLut + (ulong)(ushort)((ushort)(uVar11 / 10000) % 100) * 2);
    *(undefined2 *)(pcVar9 + 0xc) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar8 / 100) * 2);
    *(undefined2 *)(pcVar9 + 0xe) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar8 % 100) * 2);
    return pcVar9 + 0x10;
  }
  uVar11 = (ulong)value % 100000000;
  uVar10 = (ulong)value / 100000000 & 0xffffffff;
  uVar2 = (uint)(ushort)(uVar10 % 10000);
  uVar1 = (uint)(ushort)(uVar11 % 10000);
  uVar12 = (ulong)(uint)((int)(((ulong)value / 100000000 & 0xffffffff) / 1000000) * 2);
  uVar5 = ((uint)(ushort)(uVar10 / 10000) % 100) * 2;
  uVar14 = (ulong)((uVar2 / 100) * 2);
  uVar13 = (ulong)((uVar2 % 100) * 2);
  uVar2 = (int)(uVar11 / 1000000) * 2;
  uVar11 = (ulong)(((uint)(ushort)(uVar11 / 10000) % 100) * 2);
  uVar6 = (uVar1 / 100) * 2;
  uVar10 = (ulong)((uVar1 % 100) * 2);
  if ((ulong)value < 1000000000000000) {
    if (99999999999999 < (ulong)value) goto LAB_00106f00;
    if (0x48c27394 < (ulong)value >> 0xd) goto LAB_00106f15;
    if (0xe8d4a50 < (ulong)value >> 0xc) goto LAB_00106f26;
    if (0x2e90edc < (ulong)value >> 0xb) goto LAB_00106f3b;
    if (0x9502f8 < (ulong)value >> 10) goto LAB_00106f4c;
    if ((ulong)value < 1000000000) goto LAB_00106f73;
  }
  else {
    *buffer = GetDigitsLut()::cDigitsLut[uVar12];
    buffer = buffer + 1;
LAB_00106f00:
    *buffer = GetDigitsLut()::cDigitsLut[uVar12 + 1];
    buffer = buffer + 1;
LAB_00106f15:
    *buffer = GetDigitsLut()::cDigitsLut[uVar5];
    buffer = buffer + 1;
LAB_00106f26:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar5 + 1];
    buffer = buffer + 1;
LAB_00106f3b:
    *buffer = GetDigitsLut()::cDigitsLut[uVar14];
    buffer = buffer + 1;
LAB_00106f4c:
    *buffer = GetDigitsLut()::cDigitsLut[uVar14 + 1];
    buffer = buffer + 1;
  }
  *buffer = GetDigitsLut()::cDigitsLut[uVar13];
  buffer = buffer + 1;
LAB_00106f73:
  *buffer = GetDigitsLut()::cDigitsLut[uVar13 + 1];
  buffer[1] = GetDigitsLut()::cDigitsLut[uVar2];
  buffer[2] = GetDigitsLut()::cDigitsLut[(ulong)uVar2 + 1];
  buffer[3] = GetDigitsLut()::cDigitsLut[uVar11];
  buffer[4] = GetDigitsLut()::cDigitsLut[uVar11 + 1];
  buffer[5] = GetDigitsLut()::cDigitsLut[uVar6];
  buffer[6] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar6 + 1];
  buffer[7] = GetDigitsLut()::cDigitsLut[uVar10];
  buffer[8] = GetDigitsLut()::cDigitsLut[uVar10 + 1];
  return buffer + 9;
}

Assistant:

inline char* i64toa(int64_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);
    uint64_t u = static_cast<uint64_t>(value);
    if (value < 0) {
        *buffer++ = '-';
        u = ~u + 1;
    }

    return u64toa(u, buffer);
}